

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

int mp_read_int64(char **data,int64_t *ret)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  bool local_41;
  char *pcStack_30;
  uint8_t c;
  char *p;
  uint64_t uval;
  int64_t *ret_local;
  char **data_local;
  
  pcStack_30 = *data;
  uval = (uint64_t)ret;
  ret_local = (int64_t *)data;
  bVar1 = mp_load_u8(&stack0xffffffffffffffd0);
  uVar2 = bVar1 - 0xcc;
  if (uVar2 < 7 || bVar1 == 0xd3) {
    iVar3 = (*(code *)(&DAT_0012dc50 + *(int *)(&DAT_0012dc50 + (ulong)uVar2 * 4)))();
    return iVar3;
  }
  local_41 = (char)bVar1 < -0x20;
  if (local_41) {
    data_local._4_4_ = -1;
  }
  else {
    *(long *)uval = (long)(char)bVar1;
    *ret_local = (int64_t)pcStack_30;
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

MP_IMPL int
mp_read_int64(const char **data, int64_t *ret)
{
	uint64_t uval;
	const char *p = *data;
	uint8_t c = mp_load_u8(&p);
	switch (c) {
	case 0xd0:
		*ret = (int8_t) mp_load_u8(&p);
		break;
	case 0xd1:
		*ret = (int16_t) mp_load_u16(&p);
		break;
	case 0xd2:
		*ret = (int32_t) mp_load_u32(&p);
		break;
	case 0xd3:
		*ret = (int64_t) mp_load_u64(&p);
		break;
	case 0xcc:
		*ret = mp_load_u8(&p);
		break;
	case 0xcd:
		*ret = mp_load_u16(&p);
		break;
	case 0xce:
		*ret = mp_load_u32(&p);
		break;
	case 0xcf:
		uval = mp_load_u64(&p);
		if (uval > INT64_MAX)
			return -1;
		*ret = uval;
		break;
	default:
		if (mp_unlikely(c < 0xe0 && c > 0x7f))
			return -1;
		*ret = (int8_t) c;
		break;
	}
	*data = p;
	return 0;
}